

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

boolean In_W_tower(level *lev,int x,int y)

{
  boolean bVar1;
  bool local_21;
  int y_local;
  int x_local;
  level *lev_local;
  
  bVar1 = On_W_tower_level(&lev->z);
  if (bVar1 == '\0') {
    lev_local._7_1_ = false;
  }
  else if ((lev->dndest).nlx < '\x01') {
    impossible("No boundary for Wizard\'s Tower?");
    lev_local._7_1_ = false;
  }
  else {
    local_21 = false;
    if ((((lev->dndest).nlx <= x) && (local_21 = false, x <= (lev->dndest).nhx)) &&
       (local_21 = false, (lev->dndest).nly <= y)) {
      local_21 = y <= (lev->dndest).nhy;
    }
    lev_local._7_1_ = local_21;
  }
  return lev_local._7_1_;
}

Assistant:

boolean In_W_tower(const struct level *lev, int x, int y)
{
	if (!On_W_tower_level(&lev->z)) return FALSE;
	/*
	 * Both of the exclusion regions for arriving via level teleport
	 * (from above or below) define the tower's boundary.
	 *	assert( updest.nIJ == dndest.nIJ for I={l|h},J={x|y} );
	 */
	if (lev->dndest.nlx > 0)
	    return (boolean)within_bounded_area(x, y, lev->dndest.nlx, lev->dndest.nly,
						lev->dndest.nhx, lev->dndest.nhy);
	else
	    impossible("No boundary for Wizard's Tower?");
	return FALSE;
}